

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O2

void __thiscall Shell::EqualityProxy::apply(EqualityProxy *this,UnitList **units)

{
  Clause *cl;
  List<Kernel::Unit_*> **ppLVar1;
  Clause *pCVar2;
  UnitList *pUVar3;
  
  pUVar3 = (UnitList *)0x0;
  while( true ) {
    ppLVar1 = &pUVar3->_tail;
    if (pUVar3 == (UnitList *)0x0) {
      ppLVar1 = units;
    }
    pUVar3 = *ppLVar1;
    if (pUVar3 == (UnitList *)0x0) break;
    cl = (Clause *)pUVar3->_head;
    pCVar2 = apply(this,cl);
    if (cl != pCVar2) {
      pUVar3->_head = &pCVar2->super_Unit;
    }
  }
  addAxioms(this,units);
  return;
}

Assistant:

void EqualityProxy::apply(UnitList*& units)
{
  UnitList::DelIterator uit(units);
  while (uit.hasNext()) {
    Unit* unit = uit.next();
    ASS (unit->isClause());
    Clause* cl = static_cast<Clause*>(unit);
    Clause* cl2 = apply(cl);
    if (cl != cl2) {
      uit.replace(cl2);
    }
  }

  addAxioms(units);
}